

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

void __thiscall TasGrid::GridWavelet::clearRefinement(GridWavelet *this)

{
  vector<int,_std::allocator<int>_> local_20;
  
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_BaseCanonicalGrid).needed.cache_num_indexes = 0;
  (this->super_BaseCanonicalGrid).needed.num_dimensions = 0;
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&(this->super_BaseCanonicalGrid).needed.indexes,&local_20);
  if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridWavelet::clearRefinement(){ needed = MultiIndexSet(); }